

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O2

void __thiscall
boost::shared_ptr<boost::basic_wrap_stringstream<char>>::
shared_ptr<boost::basic_wrap_stringstream<char>>
          (shared_ptr<boost::basic_wrap_stringstream<char>> *this,basic_wrap_stringstream<char> *p)

{
  *(basic_wrap_stringstream<char> **)this = p;
  *(undefined8 *)(this + 8) = 0;
  detail::
  sp_pointer_construct<boost::basic_wrap_stringstream<char>,boost::basic_wrap_stringstream<char>>
            ((shared_ptr<boost::basic_wrap_stringstream<char>_> *)this,p,(shared_count *)(this + 8))
  ;
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }